

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O1

int __thiscall libnbt::NBTTagList::remove(NBTTagList *this,char *__filename)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  pointer __src;
  char *pcVar4;
  
  ppNVar3 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
            super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar4 = (char *)((long)(this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                          super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3);
  if (__filename < pcVar4) {
    if (ppNVar3[(long)__filename] != (NBTBase *)0x0) {
      (*ppNVar3[(long)__filename]->_vptr_NBTBase[5])();
    }
    ppNVar3 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
              super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar2 = (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
              super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    __src = ppNVar3 + (long)(__filename + 1);
    if (__src != ppNVar2) {
      ppNVar3 = (pointer)memmove(ppNVar3 + (long)__filename,__src,(long)ppNVar2 - (long)__src);
    }
    pppNVar1 = &(this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
  }
  return (int)CONCAT71((int7)((ulong)ppNVar3 >> 8),__filename < pcVar4);
}

Assistant:

bool NBTTagList::remove(size_t index) {
        if (index < array.size()) {
            delete (array[index]);
            array.erase(array.begin() + index);
            return true;
        }
        return false;
    }